

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O1

Point Text::extent(u16string *string)

{
  Point PVar1;
  uint uVar2;
  u16string *__range1;
  long lVar3;
  Point result;
  Point local_10;
  
  Point::Point(&local_10);
  if (string->_M_string_length != 0) {
    lVar3 = 0;
    uVar2 = local_10.row;
    do {
      if (*(short *)((long)(string->_M_dataplus)._M_p + lVar3) == 10) {
        uVar2 = uVar2 + 1;
        local_10.column = 0;
        local_10.row = uVar2;
      }
      else {
        local_10.column = local_10.column + 1;
      }
      lVar3 = lVar3 + 2;
    } while (string->_M_string_length * 2 != lVar3);
  }
  PVar1.column = local_10.column;
  PVar1.row = local_10.row;
  return PVar1;
}

Assistant:

Point Text::extent(const std::u16string &string) {
  Point result;
  for (auto c : string) {
    if (c == '\n') {
      result.row++;
      result.column = 0;
    } else {
      result.column++;
    }
  }
  return result;
}